

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

ConstTokenOrSyntax * __thiscall
slang::syntax::ConditionalConstraintSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ConditionalConstraintSyntax *this,size_t index
          )

{
  __index_type _Var1;
  ElseConstraintClauseSyntax *pEVar2;
  char *func;
  undefined4 uVar3;
  uint32_t uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  switch(index) {
  case 0:
    uVar3._0_2_ = (this->ifKeyword).kind;
    uVar3._2_1_ = (this->ifKeyword).field_0x2;
    uVar3._3_1_ = (this->ifKeyword).numFlags;
    uVar4 = (this->ifKeyword).rawLen;
    uVar5 = *(undefined4 *)&(this->ifKeyword).info;
    uVar6 = *(undefined4 *)((long)&(this->ifKeyword).info + 4);
    break;
  case 1:
    uVar3._0_2_ = (this->openParen).kind;
    uVar3._2_1_ = (this->openParen).field_0x2;
    uVar3._3_1_ = (this->openParen).numFlags;
    uVar4 = (this->openParen).rawLen;
    uVar5 = *(undefined4 *)&(this->openParen).info;
    uVar6 = *(undefined4 *)((long)&(this->openParen).info + 4);
    break;
  case 2:
    pEVar2 = (ElseConstraintClauseSyntax *)(this->condition).ptr;
    if (pEVar2 == (ElseConstraintClauseSyntax *)0x0) {
      func = 
      "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
      ;
LAB_00297afa:
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,func);
    }
    goto LAB_00297b17;
  case 3:
    uVar3._0_2_ = (this->closeParen).kind;
    uVar3._2_1_ = (this->closeParen).field_0x2;
    uVar3._3_1_ = (this->closeParen).numFlags;
    uVar4 = (this->closeParen).rawLen;
    uVar5 = *(undefined4 *)&(this->closeParen).info;
    uVar6 = *(undefined4 *)((long)&(this->closeParen).info + 4);
    break;
  case 4:
    pEVar2 = (ElseConstraintClauseSyntax *)(this->constraints).ptr;
    if (pEVar2 == (ElseConstraintClauseSyntax *)0x0) {
      func = 
      "T slang::not_null<slang::syntax::ConstraintItemSyntax *>::get() const [T = slang::syntax::ConstraintItemSyntax *]"
      ;
      goto LAB_00297afa;
    }
    goto LAB_00297b17;
  case 5:
    pEVar2 = this->elseClause;
LAB_00297b17:
    *(ElseConstraintClauseSyntax **)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         pEVar2;
    _Var1 = '\x01';
    goto LAB_00297b28;
  default:
    parsing::Token::Token((Token *)__return_storage_ptr__);
    goto LAB_00297b26;
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = uVar3;
  *(uint32_t *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   4) = uVar4;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   8) = uVar5;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0xc) = uVar6;
LAB_00297b26:
  _Var1 = '\0';
LAB_00297b28:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = _Var1;
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ConditionalConstraintSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return ifKeyword;
        case 1: return openParen;
        case 2: return condition.get();
        case 3: return closeParen;
        case 4: return constraints.get();
        case 5: return elseClause;
        default: return nullptr;
    }
}